

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O3

string_view __thiscall cinatra::http_parser::get_header_value(http_parser *this,string_view key)

{
  char cVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  difference_type __d1;
  string_view sVar9;
  difference_type __d2;
  
  sVar6 = this->num_headers_;
  if (sVar6 == 0) {
    sVar6 = 0;
    pcVar7 = (char *)0x0;
  }
  else {
    sVar5 = 0;
    do {
      sVar2 = (this->headers_)._M_elems[sVar5].name._M_len;
      if (sVar2 == key._M_len) {
        if (key._M_len == 0) {
LAB_0012b53e:
          sVar6 = (this->headers_)._M_elems[sVar5].value._M_len;
          pcVar7 = (this->headers_)._M_elems[sVar5].value._M_str;
          goto LAB_0012b555;
        }
        pcVar7 = (this->headers_)._M_elems[sVar5].name._M_str;
        sVar8 = 0;
        while( true ) {
          cVar1 = key._M_str[sVar8];
          iVar3 = tolower((int)pcVar7[sVar8]);
          iVar4 = tolower((int)cVar1);
          if (iVar3 != iVar4) break;
          sVar8 = sVar8 + 1;
          if (sVar2 == sVar8) goto LAB_0012b53e;
        }
      }
      sVar5 = sVar5 + 1;
    } while (sVar5 != sVar6);
    pcVar7 = (char *)0x0;
    sVar6 = 0;
  }
LAB_0012b555:
  sVar9._M_str = pcVar7;
  sVar9._M_len = sVar6;
  return sVar9;
}

Assistant:

std::string_view get_header_value(std::string_view key) const {
    for (size_t i = 0; i < num_headers_; i++) {
      if (iequal0(headers_[i].name, key))
        return headers_[i].value;
    }
    return {};
  }